

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

string __thiscall
mjs::anon_unknown_35::do_get_replacement_string
          (anon_unknown_35 *this,string *str,object_ptr *match,value *replace_value)

{
  uint uVar1;
  wchar_t wVar2;
  gc_heap *h;
  uint32_t uVar3;
  gc_heap_ptr_untyped *p;
  size_type sVar4;
  undefined8 *puVar5;
  string *psVar6;
  wostream *pwVar7;
  uint32_t index;
  uint32_t index_00;
  wchar_t *pwVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  wstring_view wVar13;
  wstring_view wVar14;
  string sVar15;
  undefined1 local_250 [16];
  undefined1 local_240 [40];
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  string rep_str;
  wstring_view local_1d8;
  undefined8 local_1c8;
  wchar_t *local_1c0;
  undefined8 local_1b8;
  wchar_t *local_1b0;
  wostringstream _woss;
  pointer local_1a0;
  
  if (replace_value->type_ != string) {
    args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
    local_240._0_8_ = (pointer)0x1;
    local_240._8_8_ = L"0";
    (**(code **)*puVar5)(&_woss,puVar5);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
              (&args,(value *)&_woss);
    value::~value((value *)&_woss);
    puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
    local_240._8_8_ = L"length";
    local_240._0_8_ = 6;
    (**(code **)*puVar5)(&_woss,puVar5);
    uVar3 = to_uint32((value *)&_woss);
    value::~value((value *)&_woss);
    for (uVar10 = 1; uVar10 < uVar3; uVar10 = uVar10 + 1) {
      puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
      index_string_abi_cxx11_((wstring *)local_240,(mjs *)(ulong)uVar10,index_00);
      rep_str.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)local_240._8_8_;
      rep_str.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = local_240._0_8_;
      (**(code **)*puVar5)((value *)&_woss,puVar5,&rep_str);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
                (&args,(value *)&_woss);
      value::~value((value *)&_woss);
      std::__cxx11::wstring::~wstring((wstring *)local_240);
    }
    puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
    local_240._8_8_ = L"index";
    local_240._0_8_ = 5;
    (**(code **)*puVar5)(&_woss,puVar5);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
              (&args,(value *)&_woss);
    value::~value((value *)&_woss);
    value::value((value *)&_woss,str);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
              (&args,(value *)&_woss);
    value::~value((value *)&_woss);
    h = (match->super_gc_heap_ptr_untyped).heap_;
    call_function((value *)&_woss,replace_value,(value *)&value::undefined,&args);
    to_string((mjs *)this,h,(value *)&_woss);
    value::~value((value *)&_woss);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&args);
    uVar9 = extraout_RDX;
    goto LAB_00151a79;
  }
  p = (gc_heap_ptr_untyped *)value::string_value(replace_value);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&rep_str,p);
  __woss = string::view(&rep_str);
  sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::find
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&_woss,L'$',0);
  if (sVar4 != 0xffffffffffffffff) {
    args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)&args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
    args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         (pointer)((ulong)args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
    wVar13 = string::view(&rep_str);
    pwVar8 = wVar13._M_str;
    uVar10 = 0;
LAB_0015151e:
    do {
      uVar11 = (uint)wVar13._M_len;
      if (uVar11 <= uVar10) goto LAB_00151a2a;
      if (pwVar8[uVar10] == L'$') {
        if (uVar11 <= uVar10 + 1) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
          pwVar7 = std::operator<<((wostream *)&_woss,"Not implemented: ");
          std::operator<<(pwVar7,"$ at end of string");
          std::__cxx11::wstringbuf::str();
          local_250._8_8_ = local_240._0_8_;
          local_250._0_8_ = local_240._8_8_;
          throw_runtime_error((wstring_view *)local_250,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                              ,0x12a);
        }
        wVar2 = pwVar8[uVar10 + 1];
        if (wVar2 == L'`') {
          local_250 = (undefined1  [16])string::view(str);
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
          local_1d8._M_str = L"index";
          local_1d8._M_len = 5;
          (**(code **)*puVar5)((value *)&_woss,puVar5,&local_1d8);
          uVar3 = to_uint32((value *)&_woss);
          local_240._0_16_ =
               (undefined1  [16])
               std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_250,0,
                          (ulong)uVar3);
          std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                    ((wstring *)&args,
                     (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_240);
          uVar10 = uVar10 + 2;
        }
        else {
          if (wVar2 == L'&') {
            puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
            local_250._8_8_ = L"0";
            local_250._0_8_ = 1;
            (**(code **)*puVar5)((value *)&_woss,puVar5,local_250);
            psVar6 = value::string_value((value *)&_woss);
            local_240._0_16_ = (undefined1  [16])string::view(psVar6);
            std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                      ((wstring *)&args,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_240);
            value::~value((value *)&_woss);
LAB_001515f1:
            uVar10 = uVar10 + 2;
            goto LAB_0015151e;
          }
          if (wVar2 == L'\'') {
            local_1d8 = string::view(str);
            puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
            local_1b8 = 5;
            local_1b0 = L"index";
            (**(code **)*puVar5)((value *)&_woss,puVar5,&local_1b8);
            uVar3 = to_uint32((value *)&_woss);
            puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
            local_1c8 = 1;
            local_1c0 = L"0";
            (**(code **)*puVar5)((value *)local_240,puVar5,&local_1c8);
            psVar6 = value::string_value((value *)local_240);
            wVar14 = string::view(psVar6);
            local_250 = (undefined1  [16])
                        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                                  (&local_1d8,wVar14._M_len + (ulong)uVar3,0xffffffffffffffff);
            std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                      ((wstring *)&args,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_250);
            uVar10 = uVar10 + 2;
            value::~value((value *)local_240);
          }
          else {
            if (wVar2 == L'$') {
              std::__cxx11::wstring::push_back((wchar_t)&args);
              goto LAB_001515f1;
            }
            uVar12 = wVar2 + L'\xffffffd0';
            if (9 < uVar12) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
              pwVar7 = std::operator<<((wostream *)&_woss,"Not implemented: ");
              std::operator<<(pwVar7,"Invalid replacement characters");
              std::__cxx11::wstringbuf::str();
              local_250._8_8_ = local_240._0_8_;
              local_250._0_8_ = local_240._8_8_;
              throw_runtime_error((wstring_view *)local_250,
                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                                  ,0x14c);
            }
            uVar1 = uVar10 + 2;
            if ((uVar1 < uVar11) && ((uint)(pwVar8[uVar1] + L'\xffffffd0') < 10)) {
              uVar12 = (uVar12 * 10 + pwVar8[uVar1]) - 0x30;
              uVar1 = uVar10 + 3;
            }
            uVar10 = uVar1;
            if (uVar12 == 0) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
              pwVar7 = std::operator<<((wostream *)&_woss,"Not implemented: ");
              std::operator<<(pwVar7,"$0 used");
              std::__cxx11::wstringbuf::str();
              local_250._8_8_ = local_240._0_8_;
              local_250._0_8_ = local_240._8_8_;
              throw_runtime_error((wstring_view *)local_250,
                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                                  ,0x143);
            }
            puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
            index_string_abi_cxx11_((wstring *)local_240,(mjs *)(ulong)uVar12,index);
            local_250._8_8_ = local_240._0_8_;
            local_250._0_8_ = local_240._8_8_;
            (**(code **)*puVar5)(&_woss,puVar5,local_250);
            std::__cxx11::wstring::~wstring((wstring *)local_240);
            if (__woss == string) {
              psVar6 = value::string_value((value *)&_woss);
              local_240._0_16_ = (undefined1  [16])string::view(psVar6);
              std::__cxx11::wstring::
              append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                        ((wstring *)&args,
                         (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_240);
            }
          }
        }
        value::~value((value *)&_woss);
        goto LAB_0015151e;
      }
      std::__cxx11::wstring::push_back((wchar_t)&args);
      uVar10 = uVar10 + 1;
    } while( true );
  }
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)this,(gc_heap_ptr_untyped *)&rep_str);
  goto LAB_00151a6f;
LAB_00151a2a:
  local_1a0 = args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
              super__Vector_impl_data._M_start;
  __woss = (size_t)args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  string::string((string *)this,(match->super_gc_heap_ptr_untyped).heap_,(wstring_view *)&_woss);
  std::__cxx11::wstring::~wstring((wstring *)&args);
LAB_00151a6f:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&rep_str);
  uVar9 = extraout_RDX_00;
LAB_00151a79:
  sVar15.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar9;
  sVar15.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar15.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string do_get_replacement_string(const string& str, const object_ptr& match, const value& replace_value) {
    if (replace_value.type() == value_type::string) {
        const auto rep_str = replace_value.string_value();
        if (rep_str.view().find_first_of(L'$') == std::wstring_view::npos) {
            // Fast and easy
            return rep_str;
        }

        std::wstring res;
        const auto r = rep_str.view();
        for (uint32_t i = 0, l = static_cast<uint32_t>(r.length()); i < l;) {
            if (r[i] != L'$') {
                res += r[i];
                ++i;
                continue;
            }
            ++i;
            if (i >= l) {
                NOT_IMPLEMENTED("$ at end of string");
            }
            if (r[i] == '$') {
                res += L'$';
                ++i;
            } else if (r[i] == L'&') {
                // The matched substring
                res += match->get(L"0").string_value().view();
                ++i;
            } else if (r[i] == L'`') {
                //The portion of string that precedes the matched substring.
                ++i;
                res += str.view().substr(0, to_uint32(match->get(L"index")));
            } else if (r[i] == L'\'') {
                //The portion of string that follows the matched substring.
                ++i;
                res += str.view().substr(to_uint32(match->get(L"index")) + match->get(L"0").string_value().view().length());
            } else if (isdigit(r[i])) {
                uint32_t idx = r[i]-L'0';
                ++i;
                if (i < l && isdigit(r[i])) {
                    idx = idx*10+r[i]-L'0';
                    ++i;
                }
                if (!idx) {
                    NOT_IMPLEMENTED("$0 used");
                }
                auto cval = match->get(index_string(idx));
                if (cval.type() == value_type::string) {
                    res += cval.string_value().view();
                } else {
                    // Using empty string
                }
            } else {
                NOT_IMPLEMENTED("Invalid replacement characters");
            }
        }

        return string{match.heap(), res};
    }

    std::vector<value> args;
    args.push_back(match->get(L"0"));
    const auto m = to_uint32(match->get(L"length"));
    for (uint32_t i = 1; i < m; ++i) {
        args.push_back(match->get(index_string(i)));
    }
    args.push_back(match->get(L"index"));
    args.push_back(value{str});

    return to_string(match.heap(), call_function(replace_value, value::undefined, args));
}